

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O0

void Js::AsmJsByteCodeDumper::Dump
               (FunctionBody *body,TypedRegisterAllocator *typedRegister,AsmJsFunc *asmFunc)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  Which WVar4;
  byte bVar5;
  ArgSlot AVar6;
  OpCodeAsmJs op_00;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  AsmJsFunctionInfo *this;
  undefined4 *puVar10;
  ByteBlock *this_00;
  ulong uVar11;
  char16_t *local_f0;
  int local_cc;
  int i_2;
  int endByteOffset;
  int layoutStart;
  uint uStack_b8;
  OpCodeAsmJs op;
  LayoutSize layoutSize;
  int byteOffset;
  uint32 statementIndex;
  AsmJsVarType var_1;
  uint uStack_a8;
  ArgSlot i_1;
  uint32 simdArg;
  uint32 fArg;
  uint32 dArg;
  uint32 lArg;
  uint32 iArg;
  uint32 iArgs [5];
  ushort local_7c;
  AsmJsVarType var;
  ArgSlot i;
  ArgSlot argCount;
  AsmJsFunctionInfo *funcInfo;
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  statementReader;
  ByteCodeReader reader;
  AsmJsFunc *asmFunc_local;
  TypedRegisterAllocator *typedRegister_local;
  FunctionBody *body_local;
  
  ByteCodeReader::Create((ByteCodeReader *)&statementReader.m_statementIndex,body,0);
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::StatementReader((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                     *)&funcInfo);
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::Create((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
            *)&funcInfo,body,0);
  FunctionBody::DumpFullFunctionName(body);
  Output::Print(L" Asm.js (");
  this = FunctionBody::GetAsmJsFunctionInfo(body);
  AVar6 = AsmJsFunctionInfo::GetArgCount(this);
  local_7c = 0;
  do {
    if (AVar6 <= local_7c) {
      Output::Print(L") ");
      uVar8 = FunctionBody::GetByteCodeCount(body);
      uVar9 = FunctionBody::GetByteCodeWithoutLDACount(body);
      Output::Print(L"(size: %d [%d])\n",(ulong)uVar8,(ulong)uVar9);
      asmFunc_local = (AsmJsFunc *)typedRegister;
      if ((typedRegister == (TypedRegisterAllocator *)0x0) && (asmFunc != (AsmJsFunc *)0x0)) {
        asmFunc_local = (AsmJsFunc *)AsmJsFunc::GetTypedRegisterAllocator(asmFunc);
      }
      if (asmFunc_local != (AsmJsFunc *)0x0) {
        WAsmJs::TypedRegisterAllocator::DumpLocalsInfo((TypedRegisterAllocator *)asmFunc_local);
      }
      if (asmFunc != (AsmJsFunc *)0x0) {
        DumpConstants(asmFunc,body);
      }
      if (asmFunc_local != (AsmJsFunc *)0x0) {
        Output::Print(L"    Implicit Arg Ins:\n    ======== =====\n    ");
        WAsmJs::TypedRegisterAllocator::GetArgumentStartIndex
                  ((TypedRegisterAllocator *)asmFunc_local,&lArg);
        dArg = lArg;
        fArg = iArg;
        simdArg = iArgs[1];
        uStack_a8 = iArgs[0];
        statementIndex = iArgs[2];
        for (byteOffset._2_2_ = 0; byteOffset._2_2_ < AVar6; byteOffset._2_2_ = byteOffset._2_2_ + 1
            ) {
          byteOffset._1_1_ = AsmJsFunctionInfo::GetArgType(this,byteOffset._2_2_);
          bVar3 = AsmJsVarType::isDouble((AsmJsVarType *)((long)&byteOffset + 1));
          if (bVar3) {
            uVar11 = (ulong)simdArg;
            simdArg = simdArg + 1;
            Output::Print(L" D%d  In%d",uVar11,(ulong)byteOffset._2_2_);
          }
          else {
            bVar3 = AsmJsVarType::isFloat((AsmJsVarType *)((long)&byteOffset + 1));
            if (bVar3) {
              uVar11 = (ulong)uStack_a8;
              uStack_a8 = uStack_a8 + 1;
              Output::Print(L" F%d  In%d",uVar11,(ulong)byteOffset._2_2_);
            }
            else {
              bVar3 = AsmJsVarType::isInt((AsmJsVarType *)((long)&byteOffset + 1));
              if (bVar3) {
                uVar11 = (ulong)dArg;
                dArg = dArg + 1;
                Output::Print(L" I%d  In%d",uVar11,(ulong)byteOffset._2_2_);
              }
              else {
                bVar3 = AsmJsVarType::isInt64((AsmJsVarType *)((long)&byteOffset + 1));
                if (bVar3) {
                  uVar11 = (ulong)fArg;
                  fArg = fArg + 1;
                  Output::Print(L" L%d  In%d",uVar11,(ulong)byteOffset._2_2_);
                }
                else {
                  bVar3 = AsmJsVarType::isSIMD((AsmJsVarType *)((long)&byteOffset + 1));
                  if (bVar3) {
                    uVar11 = (ulong)statementIndex;
                    statementIndex = statementIndex + 1;
                    Output::Print(L" SIMD%d  In%d",uVar11,(ulong)byteOffset._2_2_);
                  }
                  else {
                    AssertCount = AssertCount + 1;
                    Throw::LogAssert();
                    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar10 = 1;
                    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                                ,0x80,"((0))","UNREACHED");
                    if (!bVar3) {
                      pcVar1 = (code *)invalidInstructionException();
                      (*pcVar1)();
                    }
                    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar10 = 0;
                  }
                }
              }
            }
          }
          Output::Print(L"\n    ");
        }
        Output::Print(L"\n");
      }
      layoutSize = SmallLayout;
      while( true ) {
        while (bVar3 = StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                       ::AtStatementBoundary
                                 ((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                                   *)&funcInfo,(ByteCodeReader *)&statementReader.m_statementIndex),
              bVar3) {
          FunctionBody::PrintStatementSourceLine(body,layoutSize);
          layoutSize = StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                       ::MoveNextStatementBoundary
                                 ((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                                   *)&funcInfo);
        }
        uStack_b8 = ByteCodeReader::GetCurrentOffset
                              ((ByteCodeReader *)&statementReader.m_statementIndex);
        op_00 = ByteCodeReader::ReadAsmJsOp
                          ((ByteCodeReader *)&statementReader.m_statementIndex,
                           (LayoutSize *)&layoutStart);
        if (op_00 == EndOfBlock) break;
        if (layoutStart == 2) {
          local_f0 = L"L-";
        }
        else {
          local_f0 = L"";
          if (layoutStart == 1) {
            local_f0 = L"M-";
          }
        }
        Output::Print(L"    %04x %2s",(ulong)uStack_b8,local_f0);
        DumpOp(op_00,layoutStart,(ByteCodeReader *)&statementReader.m_statementIndex,body);
        uVar2 = uStack_b8;
        if ((DAT_01ec73ca & 1) != 0) {
          i_2 = uStack_b8 + 2;
          uVar8 = ByteCodeReader::GetCurrentOffset
                            ((ByteCodeReader *)&statementReader.m_statementIndex);
          Output::SkipToColumn(0x46);
          if (layoutStart == 2) {
            uVar7 = 4;
            if (MaxByteSizedOpcodes < op_00) {
              uVar7 = 5;
            }
            Output::Print(L"%02X ",(ulong)uVar7);
          }
          else if (layoutStart == 1) {
            uVar7 = 2;
            if (MaxByteSizedOpcodes < op_00) {
              uVar7 = 3;
            }
            Output::Print(L"%02X ",(ulong)uVar7);
          }
          else {
            if (layoutStart != 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                          ,0xac,"(layoutSize == SmallLayout)",
                                          "layoutSize == SmallLayout");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 0;
            }
            if (op_00 < InvalidOpCode) {
              Output::Print(L"   ");
              i_2 = uVar2 + 1;
            }
            else {
              Output::Print(L"%02X ",1);
            }
          }
          Output::Print(L"%02x",(ulong)(byte)op_00);
          for (local_cc = i_2; local_cc < (int)uVar8; local_cc = local_cc + 1) {
            bVar5 = ByteCodeReader::GetRawByte
                              ((ByteCodeReader *)&statementReader.m_statementIndex,local_cc);
            Output::Print(L" %02x",(ulong)bVar5);
          }
        }
        Output::Print(L"\n");
      }
      uVar8 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)&statementReader.m_statementIndex);
      this_00 = FunctionBody::GetByteCode(body);
      uVar9 = ByteBlock::GetLength(this_00);
      if (uVar8 != uVar9) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                    ,0x94,
                                    "(reader.GetCurrentOffset() == body->GetByteCode()->GetLength())"
                                    ,"reader.GetCurrentOffset() == body->GetByteCode()->GetLength()"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      bVar3 = StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
              ::AtStatementBoundary
                        ((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                          *)&funcInfo,(ByteCodeReader *)&statementReader.m_statementIndex);
      if (bVar3) {
        FunctionBody::PrintStatementSourceLine(body,layoutSize);
        layoutSize = StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                     ::MoveNextStatementBoundary
                               ((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                                 *)&funcInfo);
      }
      Output::Print(L"\n");
      Output::Flush();
      return;
    }
    iArgs[4]._3_1_ = AsmJsFunctionInfo::GetArgType(this,local_7c);
    if (local_7c != 0) {
      Output::Print(L", ");
    }
    bVar3 = AsmJsVarType::isDouble((AsmJsVarType *)((long)iArgs + 0x13));
    if (bVar3) {
      Output::Print(L"+In%hu",(ulong)local_7c);
    }
    else {
      bVar3 = AsmJsVarType::isFloat((AsmJsVarType *)((long)iArgs + 0x13));
      if (bVar3) {
        Output::Print(L"flt(In%hu)",(ulong)local_7c);
      }
      else {
        bVar3 = AsmJsVarType::isInt((AsmJsVarType *)((long)iArgs + 0x13));
        if (bVar3) {
          Output::Print(L"In%hu|0",(ulong)local_7c);
        }
        else {
          bVar3 = AsmJsVarType::isInt64((AsmJsVarType *)((long)iArgs + 0x13));
          if (bVar3) {
            Output::Print(L"int64(In%hu)",(ulong)local_7c);
          }
          else {
            bVar3 = AsmJsVarType::isSIMD((AsmJsVarType *)((long)iArgs + 0x13));
            if (bVar3) {
              WVar4 = AsmJsVarType::which((AsmJsVarType *)((long)iArgs + 0x13));
              switch(WVar4) {
              case Int32x4:
                Output::Print(L"I4(In%hu)",(ulong)local_7c);
                break;
              case Int8x16:
                Output::Print(L"I16(In%hu)",(ulong)local_7c);
                break;
              case Float32x4:
                Output::Print(L"F4(In%hu)",(ulong)local_7c);
                break;
              case Float64x2:
                Output::Print(L"D2(In%hu)",(ulong)local_7c);
                break;
              case Int64x2:
                Output::Print(L"I2(In%hu)",(ulong)local_7c);
              }
            }
            else {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                          ,0x47,"((0))","UNREACHED");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 0;
            }
          }
        }
      }
    }
    local_7c = local_7c + 1;
  } while( true );
}

Assistant:

void AsmJsByteCodeDumper::Dump(FunctionBody* body, const WAsmJs::TypedRegisterAllocator* typedRegister, AsmJsFunc* asmFunc)
    {
        ByteCodeReader reader;
        reader.Create(body);
        StatementReader<FunctionBody::StatementMapList> statementReader;
        statementReader.Create(body);
        body->DumpFullFunctionName();
        Output::Print(_u(" Asm.js ("));
        AsmJsFunctionInfo* funcInfo = body->GetAsmJsFunctionInfo();
        const ArgSlot argCount = funcInfo->GetArgCount();
        for (ArgSlot i = 0; i < argCount; i++)
        {
            AsmJsVarType var = funcInfo->GetArgType(i);
            if (i > 0)
            {
                Output::Print(_u(", "));
            }
            if (var.isDouble())
            {
                Output::Print(_u("+In%hu"), i);
            }
            else if (var.isFloat())
            {
                Output::Print(_u("flt(In%hu)"), i);
            }
            else if (var.isInt())
            {
                Output::Print(_u("In%hu|0"), i);
            }
            else if (var.isInt64())
            {
                Output::Print(_u("int64(In%hu)"), i);
            }
            else if (var.isSIMD())
            {
                switch (var.which())
                {
                case AsmJsType::Int32x4:
                    Output::Print(_u("I4(In%hu)"), i);
                    break;
                case AsmJsType::Int8x16:
                    Output::Print(_u("I16(In%hu)"), i);
                    break;
                case AsmJsType::Float32x4:
                    Output::Print(_u("F4(In%hu)"), i);
                    break;
                case AsmJsType::Float64x2:
                    Output::Print(_u("D2(In%hu)"), i);
                    break;
                case AsmJsType::Int64x2:
                    Output::Print(_u("I2(In%hu)"), i);
                    break;
                }
            }
            else
            {
                Assert(UNREACHED);
            }
        }

        Output::Print(_u(") "));
        Output::Print(_u("(size: %d [%d])\n"), body->GetByteCodeCount(), body->GetByteCodeWithoutLDACount());

        if (!typedRegister && asmFunc)
        {
            typedRegister = &asmFunc->GetTypedRegisterAllocator();
        }

        if (typedRegister)
        {
            typedRegister->DumpLocalsInfo();
        }

        if (asmFunc)
        {
            DumpConstants(asmFunc, body);
        }

        if (typedRegister)
        {
            Output::Print(_u("    Implicit Arg Ins:\n    ======== =====\n    "));
            uint32 iArgs[WAsmJs::LIMIT];
            typedRegister->GetArgumentStartIndex(iArgs);
            uint32 iArg = iArgs[WAsmJs::INT32];
            uint32 lArg = iArgs[WAsmJs::INT64];
            uint32 dArg = iArgs[WAsmJs::FLOAT64];
            uint32 fArg = iArgs[WAsmJs::FLOAT32];
            uint32 simdArg = iArgs[WAsmJs::SIMD];
            for (ArgSlot i = 0; i < argCount; i++)
            {
                AsmJsVarType var = funcInfo->GetArgType(i);
                if (var.isDouble())
                {
                    Output::Print(_u(" D%d  In%d"), dArg++, i);
                }
                else if (var.isFloat())
                {
                    Output::Print(_u(" F%d  In%d"), fArg++, i);
                }
                else if (var.isInt())
                {
                    Output::Print(_u(" I%d  In%d"), iArg++, i);
                }
                else if (var.isInt64())
                {
                    Output::Print(_u(" L%d  In%d"), lArg++, i);
                }
                else if (var.isSIMD())
                {
                    Output::Print(_u(" SIMD%d  In%d"), simdArg++, i);
                }
                else
                {
                    Assert(UNREACHED);
                }
                Output::Print(_u("\n    "));
            }
            Output::Print(_u("\n"));
        }

        uint32 statementIndex = 0;
        while (true)
        {
            while (statementReader.AtStatementBoundary(&reader))
            {
                body->PrintStatementSourceLine(statementIndex);
                statementIndex = statementReader.MoveNextStatementBoundary();
            }
            int byteOffset = reader.GetCurrentOffset();
            LayoutSize layoutSize;
            OpCodeAsmJs op = reader.ReadAsmJsOp(layoutSize);
            if (op == OpCodeAsmJs::EndOfBlock)
            {
                Assert(reader.GetCurrentOffset() == body->GetByteCode()->GetLength());
                break;
            }
            Output::Print(_u("    %04x %2s"), byteOffset, layoutSize == LargeLayout ? _u("L-") : layoutSize == MediumLayout ? _u("M-") : _u(""));
            DumpOp(op, layoutSize, reader, body);
            if (Js::Configuration::Global.flags.Verbose)
            {
                int layoutStart = byteOffset + 2; // Account for the prefix op
                int endByteOffset = reader.GetCurrentOffset();
                Output::SkipToColumn(70);
                if (layoutSize == LargeLayout)
                {
                    Output::Print(_u("%02X "),
                        op > Js::OpCodeAsmJs::MaxByteSizedOpcodes ?
                        Js::OpCodeAsmJs::ExtendedLargeLayoutPrefix : Js::OpCodeAsmJs::LargeLayoutPrefix);
                }
                else if (layoutSize == MediumLayout)
                {
                    Output::Print(_u("%02X "),
                        op > Js::OpCodeAsmJs::MaxByteSizedOpcodes ?
                        Js::OpCodeAsmJs::ExtendedMediumLayoutPrefix : Js::OpCodeAsmJs::MediumLayoutPrefix);
                }
                else
                {
                    Assert(layoutSize == SmallLayout);
                    if (op > Js::OpCodeAsmJs::MaxByteSizedOpcodes)
                    {
                        Output::Print(_u("%02X "), Js::OpCodeAsmJs::ExtendedOpcodePrefix);
                    }
                    else
                    {
                        Output::Print(_u("   "));
                        layoutStart--; // don't have a prefix
                    }
                }

                Output::Print(_u("%02x"), (byte)op);
                for (int i = layoutStart; i < endByteOffset; i++)
                {
                    Output::Print(_u(" %02x"), reader.GetRawByte(i));
                }
            }
            Output::Print(_u("\n"));
        }
        if (statementReader.AtStatementBoundary(&reader))
        {
            body->PrintStatementSourceLine(statementIndex);
            statementIndex = statementReader.MoveNextStatementBoundary();
        }
        Output::Print(_u("\n"));
        Output::Flush();
    }